

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

size_t Curl_multissl_version(char *buffer,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  Curl_ssl *local_38;
  int local_2c;
  char *pcStack_28;
  int i;
  char *p;
  Curl_ssl *current;
  size_t size_local;
  char *buffer_local;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    local_38 = available_backends[0];
  }
  else {
    local_38 = Curl_ssl;
  }
  if (local_38 != Curl_multissl_version::selected) {
    pcStack_28 = Curl_multissl_version::backends;
    Curl_multissl_version::selected = local_38;
    for (local_2c = 0; available_backends[local_2c] != (Curl_ssl *)0x0; local_2c = local_2c + 1) {
      if (local_2c != 0) {
        *pcStack_28 = ' ';
        pcStack_28 = pcStack_28 + 1;
      }
      if (Curl_multissl_version::selected != available_backends[local_2c]) {
        *pcStack_28 = '(';
        pcStack_28 = pcStack_28 + 1;
      }
      sVar1 = (*available_backends[local_2c]->version)
                        (pcStack_28,(long)&Curl_multissl_version::total - (long)pcStack_28);
      pcVar2 = pcStack_28 + sVar1;
      pcStack_28 = pcVar2;
      if (Curl_multissl_version::selected != available_backends[local_2c]) {
        pcStack_28 = pcVar2 + 1;
        *pcVar2 = ')';
      }
    }
    *pcStack_28 = '\0';
    Curl_multissl_version::total = (size_t)(pcStack_28 + -0x19adf0);
  }
  if (size < Curl_multissl_version::total) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  return Curl_multissl_version::total;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    int i;

    selected = current;

    for(i = 0; available_backends[i]; i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, backends + sizeof(backends) - p);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size < total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return total;
}